

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResult
          (TransformFeedbackOverflowQueryFunctionalBase *this,GLuint query,GLboolean expected)

{
  GLuint *pGVar1;
  ContextInfo *pCVar2;
  GLuint GVar3;
  TransformFeedbackOverflowQueryFunctionalBase *pTVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  bool bVar8;
  GLuint checker_query;
  GLuint initValue;
  GLuint check_result;
  GLuint actual;
  undefined4 local_50;
  GLuint local_4c;
  int local_48;
  undefined4 local_44;
  int local_40;
  GLboolean local_3c [4];
  TransformFeedbackOverflowQueryFunctionalBase *local_38;
  long lVar7;
  
  iVar6 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar6);
  pCVar2 = ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
           m_contextInfo;
  local_48 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x8b8d);
  (**(code **)(lVar7 + 0x6e0))(1,&local_50);
  (**(code **)(lVar7 + 0x1680))((this->m_checker_program->m_program).m_program);
  local_4c = query;
  (**(code **)(lVar7 + 0x18))(query,0x8e13);
  (**(code **)(lVar7 + 0x20))(0x8c87,local_50);
  (**(code **)(lVar7 + 0x538))(0,0,1);
  (**(code **)(lVar7 + 0x628))(0x8c87);
  (**(code **)(lVar7 + 0x620))();
  (**(code **)(lVar7 + 0xa20))(local_50,0x8866,&local_40);
  iVar6 = (int)CONCAT71(in_register_00000011,expected);
  bVar8 = local_40 == iVar6;
  local_38 = this;
  bVar5 = TransformFeedbackOverflowQueryBaseTest::supportsConditionalRenderInverted
                    (&this->super_TransformFeedbackOverflowQueryBaseTest);
  if (bVar5) {
    (**(code **)(lVar7 + 0x18))(local_4c,0x8e17);
    (**(code **)(lVar7 + 0x20))(0x8c87,local_50);
    (**(code **)(lVar7 + 0x538))(0,0,1);
    (**(code **)(lVar7 + 0x628))(0x8c87);
    (**(code **)(lVar7 + 0x620))();
    (**(code **)(lVar7 + 0xa20))(local_50,0x8866,&local_40);
    bVar8 = local_40 != iVar6 && bVar8;
  }
  (**(code **)(lVar7 + 0x1680))(local_48);
  GVar3 = local_4c;
  (**(code **)(lVar7 + 0xa20))(local_4c,0x8866,local_3c);
  pTVar4 = local_38;
  bVar5 = false;
  if (local_3c[0] == expected) {
    bVar5 = bVar8;
  }
  bVar8 = TransformFeedbackOverflowQueryBaseTest::supportsQueryBufferObject
                    (&local_38->super_TransformFeedbackOverflowQueryBaseTest);
  if (bVar8) {
    local_44 = 0xdeadbeef;
    pGVar1 = &pTVar4->m_query_buffer;
    (**(code **)(lVar7 + 0x6c8))(1,pGVar1);
    (**(code **)(lVar7 + 0x40))(0x9192,pTVar4->m_query_buffer);
    (**(code **)(lVar7 + 0x150))(0x9192,4,&local_44,0x88e1);
    (**(code **)(lVar7 + 0xa20))(GVar3,0x8866,0);
    (**(code **)(lVar7 + 0x7b8))(0x9192,0,4,local_3c);
    (**(code **)(lVar7 + 0x438))(1,pGVar1);
    if (local_3c[0] != expected) {
      bVar5 = false;
    }
  }
  (**(code **)(lVar7 + 0x458))(1,&local_50);
  return bVar5;
}

Assistant:

bool verifyQueryResult(GLuint query, GLboolean expected)
	{
		const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
		bool				  result = true;
		GLuint				  actual;

		GLuint current_program = m_context.getContextInfo().getInt(GL_CURRENT_PROGRAM);
		GLuint checker_query, check_result;

		// We'll use a PRIMITIVES_GENERATED query to test whether conditional
		// rendering actually executed the draw command or not. If the draw command
		// was discarded then the PRIMITIVES_GENERATED query should have a result
		// of zero.
		gl.genQueries(1, &checker_query);

		gl.useProgram(m_checker_program->getProgram());

		// Verify that conditional render discards the rendering if the expected
		// result is FALSE and renders otherwise.
		gl.beginConditionalRender(query, GL_QUERY_WAIT);
		gl.beginQuery(GL_PRIMITIVES_GENERATED, checker_query);
		gl.drawArrays(GL_POINTS, 0, 1);
		gl.endQuery(GL_PRIMITIVES_GENERATED);
		gl.endConditionalRender();
		gl.getQueryObjectuiv(checker_query, GL_QUERY_RESULT, &check_result);
		if (check_result != (GLuint)expected)
		{
			result = false;
		}

		// Verify that an inverted conditional render discards the rendering if
		// the expected result is TRUE and renders otherwise.
		if (supportsConditionalRenderInverted())
		{
			gl.beginConditionalRender(query, GL_QUERY_WAIT_INVERTED);
			gl.beginQuery(GL_PRIMITIVES_GENERATED, checker_query);
			gl.drawArrays(GL_POINTS, 0, 1);
			gl.endQuery(GL_PRIMITIVES_GENERATED);
			gl.endConditionalRender();
			gl.getQueryObjectuiv(checker_query, GL_QUERY_RESULT, &check_result);
			if (check_result == (GLuint)expected)
			{
				result = false;
			}
		}

		gl.useProgram(current_program);

		// Verify that the result of the query matches the expected result.
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &actual);
		if ((GLboolean)actual != expected)
		{
			result = false;
		}

		// Verify that the result of the query matches the expected result even
		// when using a query buffer.
		if (supportsQueryBufferObject())
		{
			const GLuint initValue = 0xDEADBEEF;

			gl.genBuffers(1, &m_query_buffer);
			gl.bindBuffer(GL_QUERY_BUFFER, m_query_buffer);
			gl.bufferData(GL_QUERY_BUFFER, sizeof(initValue), &initValue, GL_STREAM_READ);
			gl.getQueryObjectuiv(query, GL_QUERY_RESULT, NULL);
			gl.getBufferSubData(GL_QUERY_BUFFER, 0, sizeof(actual), &actual);
			gl.deleteBuffers(1, &m_query_buffer);

			if ((GLboolean)actual != expected)
			{
				result = false;
			}
		}

		gl.deleteQueries(1, &checker_query);

		return result;
	}